

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.cpp
# Opt level: O0

RPCHelpMan * wallet::listdescriptors(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffeb48;
  allocator<RPCResult> *paVar2;
  vector<RPCResult,_std::allocator<RPCResult>_> *pvVar3;
  RPCArg *this;
  UniValue *in_stack_ffffffffffffeb50;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffeb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeb60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeb78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeb80;
  UniValue *in_stack_ffffffffffffeb88;
  char *in_stack_ffffffffffffeb90;
  undefined7 in_stack_ffffffffffffeb98;
  undefined1 in_stack_ffffffffffffeb9f;
  string *in_stack_ffffffffffffeba0;
  undefined7 in_stack_ffffffffffffeba8;
  undefined1 in_stack_ffffffffffffebaf;
  undefined4 in_stack_ffffffffffffebb0;
  Type in_stack_ffffffffffffebb4;
  string *in_stack_ffffffffffffebb8;
  undefined4 in_stack_ffffffffffffebc0;
  Type in_stack_ffffffffffffebc4;
  undefined4 in_stack_ffffffffffffebc8;
  Type in_stack_ffffffffffffebcc;
  RPCResult *in_stack_ffffffffffffebd0;
  undefined1 *local_13d0;
  undefined1 *local_13b8;
  undefined1 *local_13a0;
  undefined1 *local_1388;
  RPCExamples *in_stack_ffffffffffffec90;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_00;
  _Any_data *fun;
  undefined1 local_10c8 [37];
  undefined1 local_10a3;
  undefined1 local_10a2;
  undefined1 local_10a1;
  undefined1 local_10a0 [2];
  allocator<char> local_109e;
  allocator<char> local_109d;
  allocator<char> local_109c [4];
  pointer local_1098;
  undefined1 auStack_1090 [22];
  allocator<char> local_107a;
  allocator<char> local_1079 [30];
  allocator<char> local_105b;
  allocator<char> local_105a [10];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1050;
  allocator<char> local_103a;
  allocator<char> local_1039 [9];
  pointer pRStack_1030;
  _Alloc_hider local_1028;
  allocator<char> local_101a;
  allocator<char> local_1019 [25];
  undefined1 local_1000 [7];
  allocator<char> aaStack_ff9 [9];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_ff0;
  allocator<char> local_fda;
  allocator<char> local_fd9;
  _Any_data local_fd8;
  undefined8 local_fc8;
  allocator<char> local_fba;
  allocator<char> local_fb9;
  undefined8 local_fb8;
  undefined8 uStack_fb0;
  undefined8 local_fa8;
  allocator<char> local_f9a;
  allocator<char> local_f99;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  allocator<char> local_f7a;
  allocator<char> local_f79 [31];
  allocator<char> local_f5a;
  allocator<char> local_f59 [31];
  allocator<char> local_f3a;
  allocator<char> local_f39;
  undefined8 local_f38;
  undefined8 uStack_f30;
  undefined8 local_f28;
  allocator<char> local_f1a;
  allocator<char> local_f19 [31];
  allocator<char> local_efa;
  allocator<char> local_ef9 [30];
  allocator<char> local_edb;
  undefined1 local_eda;
  allocator<char> local_ed9 [31];
  allocator<char> local_eba;
  allocator<char> local_eb9 [769];
  undefined1 local_bb8 [272];
  undefined1 local_aa8 [320];
  undefined1 local_968 [952];
  undefined1 local_5b0 [64];
  undefined1 local_570 [136];
  undefined1 local_4e8 [128];
  undefined1 local_468 [272];
  undefined1 local_358 [200];
  undefined1 local_290;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined1 local_250;
  undefined1 local_24f;
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  _local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  local_eda = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffeb88,(bool *)in_stack_ffffffffffffeb80);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffeb58,in_stack_ffffffffffffeb50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  local_290 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffeb60);
  local_268 = 0;
  uStack_260 = 0;
  local_258 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffeb48);
  local_250 = 0;
  local_24f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
                 in_stack_ffffffffffffebb8,in_stack_ffffffffffffebb4,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffebaf,in_stack_ffffffffffffeba8),
                 in_stack_ffffffffffffeba0,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffeb48);
  __l._M_len._0_7_ = in_stack_ffffffffffffeb98;
  __l._M_array = (iterator)in_stack_ffffffffffffeb90;
  __l._M_len._7_1_ = in_stack_ffffffffffffeb9f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffeb88,__l,
             (allocator_type *)in_stack_ffffffffffffeb80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  local_f38 = 0;
  uStack_f30 = 0;
  local_f28 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb48);
  RPCResult::RPCResult
            (in_stack_ffffffffffffebd0,in_stack_ffffffffffffebcc,
             (string *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
             in_stack_ffffffffffffebb8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
             (bool)in_stack_ffffffffffffebaf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  local_f98 = 0;
  uStack_f90 = 0;
  local_f88 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb48);
  RPCResult::RPCResult
            (in_stack_ffffffffffffebd0,in_stack_ffffffffffffebcc,
             (string *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
             in_stack_ffffffffffffebb8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
             (bool)in_stack_ffffffffffffebaf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  local_fb8 = 0;
  uStack_fb0 = 0;
  local_fa8 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb48);
  RPCResult::RPCResult
            (in_stack_ffffffffffffebd0,in_stack_ffffffffffffebcc,
             (string *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
             in_stack_ffffffffffffebb8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
             (bool)in_stack_ffffffffffffebaf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  local_fd8._M_unused._M_object = (void *)0x0;
  local_fd8._8_8_ = 0;
  local_fc8._0_1_ = false;
  local_fc8._1_1_ = false;
  local_fc8._2_6_ = 0;
  fun = &local_fd8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb48);
  RPCResult::RPCResult
            (in_stack_ffffffffffffebd0,in_stack_ffffffffffffebcc,
             (string *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
             in_stack_ffffffffffffebb8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
             (bool)in_stack_ffffffffffffebaf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  aaStack_ff9[1] = (allocator<char>)0x0;
  aaStack_ff9[2] = (allocator<char>)0x0;
  aaStack_ff9[3] = (allocator<char>)0x0;
  aaStack_ff9[4] = (allocator<char>)0x0;
  aaStack_ff9[5] = (allocator<char>)0x0;
  aaStack_ff9[6] = (allocator<char>)0x0;
  aaStack_ff9[7] = (allocator<char>)0x0;
  aaStack_ff9[8] = (allocator<char>)0x0;
  aStack_ff0._M_allocated_capacity = 0;
  aStack_ff0._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb48);
  paVar2 = (allocator<RPCResult> *)((ulong)in_stack_ffffffffffffeb48 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffebcc,in_stack_ffffffffffffebc8),
             in_stack_ffffffffffffebc4,in_stack_ffffffffffffebb8,
             SUB41(in_stack_ffffffffffffebb4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffebaf,in_stack_ffffffffffffeba8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeba0,
             (bool)in_stack_ffffffffffffeb9f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  local_1039._1_8_ = (pointer)0x0;
  pRStack_1030 = (pointer)0x0;
  local_1028._M_p = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffebd0,in_stack_ffffffffffffebcc,
             (string *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
             in_stack_ffffffffffffebb8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
             (bool)in_stack_ffffffffffffebaf);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  local_105a[2] = (allocator<char>)0x0;
  local_105a[3] = (allocator<char>)0x0;
  local_105a[4] = (allocator<char>)0x0;
  local_105a[5] = (allocator<char>)0x0;
  local_105a[6] = (allocator<char>)0x0;
  local_105a[7] = (allocator<char>)0x0;
  local_105a[8] = (allocator<char>)0x0;
  local_105a[9] = (allocator<char>)0x0;
  aStack_1050._M_allocated_capacity = 0;
  aStack_1050._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)paVar2);
  RPCResult::RPCResult
            (in_stack_ffffffffffffebd0,in_stack_ffffffffffffebcc,
             (string *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
             in_stack_ffffffffffffebb8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
             (bool)in_stack_ffffffffffffebaf);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffeb98;
  __l_00._M_array = (iterator)in_stack_ffffffffffffeb90;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffeb9f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb88,__l_00,
             (allocator_type *)in_stack_ffffffffffffeb80);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)paVar2 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffebcc,in_stack_ffffffffffffebc8),
             in_stack_ffffffffffffebc4,in_stack_ffffffffffffebb8,
             SUB41(in_stack_ffffffffffffebb4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffebaf,in_stack_ffffffffffffeba8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeba0,
             (bool)in_stack_ffffffffffffeb9f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  local_1079[1] = (allocator<char>)0x0;
  local_1079[2] = (allocator<char>)0x0;
  local_1079[3] = (allocator<char>)0x0;
  local_1079[4] = (allocator<char>)0x0;
  local_1079[5] = (allocator<char>)0x0;
  local_1079[6] = (allocator<char>)0x0;
  local_1079[7] = (allocator<char>)0x0;
  local_1079[8] = (allocator<char>)0x0;
  local_1079._9_8_ = (_Manager_type)0x0;
  local_1079._17_8_ = (_Invoker_type)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  pvVar3 = (vector<RPCResult,_std::allocator<RPCResult>_> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffebcc,in_stack_ffffffffffffebc8),
             in_stack_ffffffffffffebc4,in_stack_ffffffffffffebb8,
             SUB41(in_stack_ffffffffffffebb4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffebaf,in_stack_ffffffffffffeba8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeba0,
             (bool)in_stack_ffffffffffffeb9f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  local_1098 = (pointer)0x0;
  auStack_1090._0_8_ = 0;
  auStack_1090._8_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(pvVar3);
  paVar2 = (allocator<RPCResult> *)((ulong)pvVar3 & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffebcc,in_stack_ffffffffffffebc8),
             in_stack_ffffffffffffebc4,in_stack_ffffffffffffebb8,
             SUB41(in_stack_ffffffffffffebb4 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffebaf,in_stack_ffffffffffffeba8),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeba0,
             (bool)in_stack_ffffffffffffeb9f);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffeb98;
  __l_01._M_array = (iterator)in_stack_ffffffffffffeb90;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffeb9f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb88,__l_01,
             (allocator_type *)in_stack_ffffffffffffeb80);
  RPCResult::RPCResult
            (in_stack_ffffffffffffebd0,in_stack_ffffffffffffebcc,
             (string *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
             in_stack_ffffffffffffebb8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
             (bool)in_stack_ffffffffffffebaf);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffeb98;
  __l_02._M_array = (iterator)in_stack_ffffffffffffeb90;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffeb9f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb88,__l_02,
             (allocator_type *)in_stack_ffffffffffffeb80);
  RPCResult::RPCResult
            (in_stack_ffffffffffffebd0,in_stack_ffffffffffffebcc,
             (string *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
             in_stack_ffffffffffffebb8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
             (bool)in_stack_ffffffffffffebaf);
  std::allocator<RPCResult>::allocator(paVar2);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffeb98;
  __l_03._M_array = (iterator)in_stack_ffffffffffffeb90;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffeb9f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb88,__l_03,
             (allocator_type *)in_stack_ffffffffffffeb80);
  RPCResult::RPCResult
            (in_stack_ffffffffffffebd0,in_stack_ffffffffffffebcc,
             (string *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0),
             in_stack_ffffffffffffebb8,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffebb4,in_stack_ffffffffffffebb0),
             (bool)in_stack_ffffffffffffebaf);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffebcc,in_stack_ffffffffffffebc8),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffebc4,in_stack_ffffffffffffebc0));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  HelpExampleCli(in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  HelpExampleRpc(in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78);
  std::operator+(in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78);
  this_00 = (RPCHelpMan *)local_10a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  name = (string *)&local_10a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  HelpExampleCli(in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78);
  std::operator+(in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78);
  description = (string *)&local_10a2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)&local_10a3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffeb9f,in_stack_ffffffffffffeb98),in_stack_ffffffffffffeb90
             ,(allocator<char> *)in_stack_ffffffffffffeb88);
  HelpExampleRpc(in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78);
  std::operator+(in_stack_ffffffffffffeb80,in_stack_ffffffffffffeb78);
  RPCExamples::RPCExamples((RPCExamples *)paVar2,(string *)0xc15b1d);
  this = (RPCArg *)local_10c8;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::listdescriptors()::__0,void>
            (in_stack_ffffffffffffeb58,(anon_class_1_0_00000001 *)in_stack_ffffffffffffeb50);
  RPCHelpMan::RPCHelpMan
            (this_00,name,description,args,(RPCResults *)this,in_stack_ffffffffffffec90,
             (RPCMethodImpl *)fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_10a3);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_10a2);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_10a1);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_10a0);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_10a0 + 1));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_109e);
  std::__cxx11::string::~string(&this->m_names);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_109d);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_109c);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult((RPCResult *)this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb58);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  puVar1 = local_358;
  do {
    puVar1 = puVar1 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (puVar1 != local_468);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb58);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_1388 = local_4e8;
  do {
    local_1388 = local_1388 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_1388 != local_570);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb58);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_13a0 = local_5b0;
  do {
    local_13a0 = local_13a0 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_13a0 != local_968);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb58);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_107a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1079);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb58);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_105b);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_105a);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb58);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  local_13b8 = local_aa8;
  do {
    local_13b8 = local_13b8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this);
  } while (local_13b8 != local_bb8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb58);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_103a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1039);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb58);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_101a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_1019);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1000 + 6));
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1000 + 7));
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb58);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_fda);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_fd9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb58);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_fba);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_fb9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb58);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_f9a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_f99);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb58);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_f7a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_f79);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_f5a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_f59);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_f3a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_f39);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffeb58);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_f1a);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_f19);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_efa);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_ef9);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffeb58);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this);
  local_13d0 = local_48;
  do {
    local_13d0 = local_13d0 + -0x108;
    RPCArg::~RPCArg(this);
  } while (local_13d0 != local_150);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_edb);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this);
  UniValue::~UniValue((UniValue *)this);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_ed9);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(&local_eba);
  std::__cxx11::string::~string(&this->m_names);
  std::allocator<char>::~allocator(local_eb9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan listdescriptors()
{
    return RPCHelpMan{
        "listdescriptors",
        "\nList descriptors imported into a descriptor-enabled wallet.\n",
        {
            {"private", RPCArg::Type::BOOL, RPCArg::Default{false}, "Show private descriptors."}
        },
        RPCResult{RPCResult::Type::OBJ, "", "", {
            {RPCResult::Type::STR, "wallet_name", "Name of wallet this operation was performed on"},
            {RPCResult::Type::ARR, "descriptors", "Array of descriptor objects (sorted by descriptor string representation)",
            {
                {RPCResult::Type::OBJ, "", "", {
                    {RPCResult::Type::STR, "desc", "Descriptor string representation"},
                    {RPCResult::Type::NUM, "timestamp", "The creation time of the descriptor"},
                    {RPCResult::Type::BOOL, "active", "Whether this descriptor is currently used to generate new addresses"},
                    {RPCResult::Type::BOOL, "internal", /*optional=*/true, "True if this descriptor is used to generate change addresses. False if this descriptor is used to generate receiving addresses; defined only for active descriptors"},
                    {RPCResult::Type::ARR_FIXED, "range", /*optional=*/true, "Defined only for ranged descriptors", {
                        {RPCResult::Type::NUM, "", "Range start inclusive"},
                        {RPCResult::Type::NUM, "", "Range end inclusive"},
                    }},
                    {RPCResult::Type::NUM, "next", /*optional=*/true, "Same as next_index field. Kept for compatibility reason."},
                    {RPCResult::Type::NUM, "next_index", /*optional=*/true, "The next index to generate addresses from; defined only for ranged descriptors"},
                }},
            }}
        }},
        RPCExamples{
            HelpExampleCli("listdescriptors", "") + HelpExampleRpc("listdescriptors", "")
            + HelpExampleCli("listdescriptors", "true") + HelpExampleRpc("listdescriptors", "true")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    const std::shared_ptr<const CWallet> wallet = GetWalletForJSONRPCRequest(request);
    if (!wallet) return UniValue::VNULL;

    if (!wallet->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
        throw JSONRPCError(RPC_WALLET_ERROR, "listdescriptors is not available for non-descriptor wallets");
    }

    const bool priv = !request.params[0].isNull() && request.params[0].get_bool();
    if (priv) {
        EnsureWalletIsUnlocked(*wallet);
    }

    LOCK(wallet->cs_wallet);

    const auto active_spk_mans = wallet->GetActiveScriptPubKeyMans();

    struct WalletDescInfo {
        std::string descriptor;
        uint64_t creation_time;
        bool active;
        std::optional<bool> internal;
        std::optional<std::pair<int64_t,int64_t>> range;
        int64_t next_index;
    };

    std::vector<WalletDescInfo> wallet_descriptors;
    for (const auto& spk_man : wallet->GetAllScriptPubKeyMans()) {
        const auto desc_spk_man = dynamic_cast<DescriptorScriptPubKeyMan*>(spk_man);
        if (!desc_spk_man) {
            throw JSONRPCError(RPC_WALLET_ERROR, "Unexpected ScriptPubKey manager type.");
        }
        LOCK(desc_spk_man->cs_desc_man);
        const auto& wallet_descriptor = desc_spk_man->GetWalletDescriptor();
        std::string descriptor;
        if (!desc_spk_man->GetDescriptorString(descriptor, priv)) {
            throw JSONRPCError(RPC_WALLET_ERROR, "Can't get descriptor string.");
        }
        const bool is_range = wallet_descriptor.descriptor->IsRange();
        wallet_descriptors.push_back({
            descriptor,
            wallet_descriptor.creation_time,
            active_spk_mans.count(desc_spk_man) != 0,
            wallet->IsInternalScriptPubKeyMan(desc_spk_man),
            is_range ? std::optional(std::make_pair(wallet_descriptor.range_start, wallet_descriptor.range_end)) : std::nullopt,
            wallet_descriptor.next_index
        });
    }

    std::sort(wallet_descriptors.begin(), wallet_descriptors.end(), [](const auto& a, const auto& b) {
        return a.descriptor < b.descriptor;
    });

    UniValue descriptors(UniValue::VARR);
    for (const WalletDescInfo& info : wallet_descriptors) {
        UniValue spk(UniValue::VOBJ);
        spk.pushKV("desc", info.descriptor);
        spk.pushKV("timestamp", info.creation_time);
        spk.pushKV("active", info.active);
        if (info.internal.has_value()) {
            spk.pushKV("internal", info.internal.value());
        }
        if (info.range.has_value()) {
            UniValue range(UniValue::VARR);
            range.push_back(info.range->first);
            range.push_back(info.range->second - 1);
            spk.pushKV("range", std::move(range));
            spk.pushKV("next", info.next_index);
            spk.pushKV("next_index", info.next_index);
        }
        descriptors.push_back(std::move(spk));
    }

    UniValue response(UniValue::VOBJ);
    response.pushKV("wallet_name", wallet->GetName());
    response.pushKV("descriptors", std::move(descriptors));

    return response;
},
    };
}